

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::TextureViewGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator=
          (RefCntAutoPtr<Diligent::TextureViewGLImpl> *this,TextureViewGLImpl *pObj)

{
  TextureViewGLImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (TextureViewGLImpl *)0x0) {
      DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
      ::Release((DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (TextureViewGLImpl *)0x0) {
      RefCountedObject<Diligent::ITextureViewGL>::AddRef
                ((RefCountedObject<Diligent::ITextureViewGL> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }